

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ossl_set_engine(Curl_easy *data,char *engine)

{
  ENGINE *e;
  int iVar1;
  CURLcode CVar2;
  ENGINE *e_00;
  ulong e_01;
  char buf [256];
  char acStack_118 [256];
  
  e_00 = ENGINE_by_id(engine);
  if (e_00 == (ENGINE *)0x0) {
    Curl_failf(data,"SSL Engine \'%s\' not found",engine);
    CVar2 = CURLE_SSL_ENGINE_NOTFOUND;
  }
  else {
    e = (ENGINE *)(data->state).engine;
    if (e != (ENGINE *)0x0) {
      ENGINE_finish(e);
      ENGINE_free((ENGINE *)(data->state).engine);
      (data->state).engine = (void *)0x0;
    }
    iVar1 = ENGINE_init(e_00);
    if (iVar1 == 0) {
      ENGINE_free(e_00);
      e_01 = ERR_get_error();
      ERR_error_string_n(e_01,acStack_118,0x100);
      Curl_failf(data,"Failed to initialise SSL Engine \'%s\':\n%s",engine,acStack_118);
      CVar2 = CURLE_SSL_ENGINE_INITFAILED;
    }
    else {
      (data->state).engine = e_00;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode Curl_ossl_set_engine(struct Curl_easy *data,
                                     const char *engine)
{
#ifdef USE_OPENSSL_ENGINE
  ENGINE *e;

#if OPENSSL_VERSION_NUMBER >= 0x00909000L
  e = ENGINE_by_id(engine);
#else
  /* avoid memory leak */
  for(e = ENGINE_get_first(); e; e = ENGINE_get_next(e)) {
    const char *e_id = ENGINE_get_id(e);
    if(!strcmp(engine, e_id))
      break;
  }
#endif

  if(!e) {
    failf(data, "SSL Engine '%s' not found", engine);
    return CURLE_SSL_ENGINE_NOTFOUND;
  }

  if(data->state.engine) {
    ENGINE_finish(data->state.engine);
    ENGINE_free(data->state.engine);
    data->state.engine = NULL;
  }
  if(!ENGINE_init(e)) {
    char buf[256];

    ENGINE_free(e);
    failf(data, "Failed to initialise SSL Engine '%s':\n%s",
          engine, ossl_strerror(ERR_get_error(), buf, sizeof(buf)));
    return CURLE_SSL_ENGINE_INITFAILED;
  }
  data->state.engine = e;
  return CURLE_OK;
#else
  (void)engine;
  failf(data, "SSL Engine not supported");
  return CURLE_SSL_ENGINE_NOTFOUND;
#endif
}